

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExprParserHelper.cxx
# Opt level: O3

int __thiscall cmExprParserHelper::ParseString(cmExprParserHelper *this,char *str,int verb)

{
  char *pcVar1;
  int iVar2;
  yyscan_t in_RAX;
  size_t sVar3;
  ostream *poVar4;
  int iVar5;
  yyscan_t yyscanner;
  yyscan_t local_38;
  
  if (str == (char *)0x0) {
    iVar5 = 0;
  }
  else {
    this->Verbose = verb;
    pcVar1 = (char *)(this->InputBuffer)._M_string_length;
    local_38 = in_RAX;
    strlen(str);
    iVar5 = 0;
    std::__cxx11::string::_M_replace((ulong)&this->InputBuffer,0,pcVar1,(ulong)str);
    this->InputBufferPos = 0;
    this->CurrentLine = 0;
    this->Result = 0;
    cmExpr_yylex_init(&local_38);
    cmExpr_yyset_extra(this,local_38);
    iVar2 = cmExpr_yyparse(local_38);
    cmExpr_yylex_destroy(local_38);
    if ((iVar2 == 0) && (iVar5 = 1, this->Verbose != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expanding [",0xb);
      sVar3 = strlen(str);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,str,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] produced: [",0xd);
      poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,this->Result);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  return iVar5;
}

Assistant:

int cmExprParserHelper::ParseString(const char* str, int verb)
{
  if ( !str)
    {
    return 0;
    }
  //printf("Do some parsing: %s\n", str);

  this->Verbose = verb;
  this->InputBuffer = str;
  this->InputBufferPos = 0;
  this->CurrentLine = 0;

  this->Result = 0;

  yyscan_t yyscanner;
  cmExpr_yylex_init(&yyscanner);
  cmExpr_yyset_extra(this, yyscanner);
  int res = cmExpr_yyparse(yyscanner);
  cmExpr_yylex_destroy(yyscanner);
  if ( res != 0 )
    {
    //str << "CAL_Parser returned: " << res << std::endl;
    //std::cerr << "When parsing: [" << str << "]" << std::endl;
    return 0;
    }

  this->CleanupParser();

  if ( Verbose )
    {
    std::cerr << "Expanding [" << str << "] produced: ["
              << this->Result << "]" << std::endl;
    }
  return 1;
}